

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_polylinecurve.cpp
# Opt level: O3

bool __thiscall ON_PolylineCurve::GetSpanVector(ON_PolylineCurve *this,double *s)

{
  uint uVar1;
  
  uVar1 = ON_Polyline::PointCount(&this->m_pline);
  if (0 < (int)uVar1) {
    memcpy(s,(this->m_t).m_a,(ulong)uVar1 << 3);
  }
  return 0 < (int)uVar1;
}

Assistant:

bool ON_PolylineCurve::GetSpanVector( // span "knots" 
       double* s // array of length SpanCount() + 1 
       ) const
{
  bool rc = false;
  const int count = PointCount();
  if ( count >= 1 ) 
  {
    memcpy( s, m_t.Array(), count*sizeof(*s) );
    rc = true;
  }
  return rc;
}